

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::InputFile::rawPixelData
          (InputFile *this,int firstScanLine,char **pixelData,int *pixelDataSize)

{
  Data *pDVar1;
  ArgExc *this_00;
  char *pcVar2;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  if (pDVar1->dsFile == (DeepScanLineInputFile *)0x0) {
    if (pDVar1->isTiled != true) {
      ScanLineInputFile::rawPixelData(pDVar1->sFile,firstScanLine,pixelData,pixelDataSize);
      return;
    }
    pcVar2 = "Tried to read a raw scanline from a tiled image.";
  }
  else {
    pcVar2 = "Tried to read a raw scanline from a deep image.";
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,pcVar2);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::rawPixelData (int firstScanLine,
			 const char *&pixelData,
			 int &pixelDataSize)
{
    try
    {
        if (_data->dsFile)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
            "from a deep image.");
        }
        
	else if (_data->isTiled)
	{
	    throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
			       "from a tiled image.");
	}
        
        _data->sFile->rawPixelData (firstScanLine, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}